

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer_init(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uv_timer_t *loop;
  uv_loop_t *unaff_RBX;
  uint64_t eval_b;
  uint64_t eval_a;
  uv_timer_t handle;
  uv_timer_t uStack_2e0;
  uv_loop_t *puStack_248;
  code *pcStack_240;
  uv_loop_t *puStack_238;
  code *pcStack_230;
  void *pvStack_228;
  undefined1 auStack_220 [16];
  code *pcStack_210;
  code *pcStack_208;
  undefined1 auStack_200 [8];
  undefined1 auStack_1f8 [152];
  undefined1 auStack_160 [160];
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)&stack0xffffffffffffff60);
  if (iVar1 == 0) {
    uVar3 = uv_timer_get_repeat((uv_timer_t *)&stack0xffffffffffffff60);
    if (uVar3 != 0) goto LAB_0018280c;
    uv_timer_get_due_in((uv_timer_t *)&stack0xffffffffffffff60);
    iVar1 = uv_is_active((uv_handle_t *)&stack0xffffffffffffff60);
    if (iVar1 != 0) goto LAB_00182820;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_timer_init_cold_1();
LAB_0018280c:
    run_test_timer_init_cold_2();
    run_test_timer_init_cold_5();
LAB_00182820:
    run_test_timer_init_cold_3();
  }
  run_test_timer_init_cold_4();
  auStack_200._4_4_ = 0;
  auStack_200._0_4_ = 1;
  pcStack_208 = (code *)0x182848;
  auStack_160._152_8_ = unaff_RBX;
  puVar2 = uv_default_loop();
  pcStack_208 = (code *)0x182858;
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)auStack_160);
  if (iVar1 == 0) {
    pcStack_208 = (code *)0x182865;
    puVar2 = uv_default_loop();
    pcStack_208 = (code *)0x182872;
    iVar1 = uv_timer_init(puVar2,(uv_timer_t *)auStack_1f8);
    if (iVar1 != 0) goto LAB_001829c8;
    unaff_RBX = (uv_loop_t *)(auStack_200 + 4);
    puVar2 = (uv_loop_t *)auStack_160;
    pcStack_208 = (code *)0x18289a;
    auStack_160._0_8_ = unaff_RBX;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_001829cd;
    puVar2 = (uv_loop_t *)auStack_1f8;
    pcStack_208 = (code *)0x1828bd;
    auStack_1f8._0_8_ = (uv_loop_t *)auStack_200;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_001829d2;
    pcStack_208 = (code *)0x1828ca;
    puVar2 = uv_default_loop();
    pcStack_208 = (code *)0x1828d4;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001829d7;
    if (order_cb_called != 2) goto LAB_001829dc;
    puVar2 = (uv_loop_t *)auStack_160;
    pcStack_208 = (code *)0x1828f6;
    iVar1 = uv_timer_stop((uv_timer_t *)puVar2);
    if (iVar1 != 0) goto LAB_001829e1;
    puVar2 = (uv_loop_t *)auStack_1f8;
    pcStack_208 = (code *)0x182908;
    iVar1 = uv_timer_stop((uv_timer_t *)puVar2);
    if (iVar1 != 0) goto LAB_001829e6;
    order_cb_called = 0;
    puVar2 = (uv_loop_t *)auStack_1f8;
    pcStack_208 = (code *)0x182932;
    auStack_1f8._0_8_ = unaff_RBX;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_001829eb;
    puVar2 = (uv_loop_t *)auStack_160;
    pcStack_208 = (code *)0x182955;
    auStack_160._0_8_ = (uv_loop_t *)auStack_200;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_001829f0;
    pcStack_208 = (code *)0x182962;
    puVar2 = uv_default_loop();
    pcStack_208 = (code *)0x18296c;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001829f5;
    if (order_cb_called != 2) goto LAB_001829fa;
    pcStack_208 = (code *)0x182982;
    unaff_RBX = uv_default_loop();
    pcStack_208 = (code *)0x182996;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_208 = (code *)0x1829a0;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_208 = (code *)0x1829a5;
    puVar2 = uv_default_loop();
    pcStack_208 = (code *)0x1829ad;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      pcStack_208 = (code *)0x1829b6;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_208 = (code *)0x1829c8;
    run_test_timer_order_cold_1();
LAB_001829c8:
    pcStack_208 = (code *)0x1829cd;
    run_test_timer_order_cold_2();
LAB_001829cd:
    pcStack_208 = (code *)0x1829d2;
    run_test_timer_order_cold_3();
LAB_001829d2:
    pcStack_208 = (code *)0x1829d7;
    run_test_timer_order_cold_4();
LAB_001829d7:
    pcStack_208 = (code *)0x1829dc;
    run_test_timer_order_cold_5();
LAB_001829dc:
    pcStack_208 = (code *)0x1829e1;
    run_test_timer_order_cold_6();
LAB_001829e1:
    pcStack_208 = (code *)0x1829e6;
    run_test_timer_order_cold_7();
LAB_001829e6:
    pcStack_208 = (code *)0x1829eb;
    run_test_timer_order_cold_8();
LAB_001829eb:
    pcStack_208 = (code *)0x1829f0;
    run_test_timer_order_cold_9();
LAB_001829f0:
    pcStack_208 = (code *)0x1829f5;
    run_test_timer_order_cold_10();
LAB_001829f5:
    pcStack_208 = (code *)0x1829fa;
    run_test_timer_order_cold_11();
LAB_001829fa:
    pcStack_208 = (code *)0x1829ff;
    run_test_timer_order_cold_12();
  }
  pcStack_208 = order_cb_a;
  run_test_timer_order_cold_13();
  iVar1 = order_cb_called;
  pcStack_208 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == *puVar2->data) {
    return iVar1;
  }
  pcStack_210 = order_cb_b;
  order_cb_a_cold_1();
  iVar1 = order_cb_called;
  pcStack_210 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == *puVar2->data) {
    return iVar1;
  }
  auStack_220._8_8_ = run_test_timer_huge_timeout;
  order_cb_b_cold_1();
  pcStack_230 = (code *)0x182a48;
  auStack_220._8_8_ = unaff_RBX;
  puVar2 = uv_default_loop();
  pcStack_230 = (code *)0x182a57;
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_230 = (code *)0x182a64;
    puVar2 = uv_default_loop();
    pcStack_230 = (code *)0x182a73;
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    if (iVar1 != 0) goto LAB_00182bd8;
    pcStack_230 = (code *)0x182a80;
    puVar2 = uv_default_loop();
    pcStack_230 = (code *)0x182a8f;
    iVar1 = uv_timer_init(puVar2,&huge_timer2);
    if (iVar1 != 0) goto LAB_00182bdd;
    pcStack_230 = (code *)0x182ab1;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00182be2;
    unaff_RBX = (uv_loop_t *)0xffffffffffff;
    pcStack_230 = (code *)0x182adb;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    if (iVar1 != 0) goto LAB_00182be7;
    pcStack_230 = (code *)0x182aff;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    if (iVar1 != 0) goto LAB_00182bec;
    auStack_220._0_8_ = (void *)0x1;
    pcStack_230 = (code *)0x182b1c;
    pvStack_228 = (void *)uv_timer_get_due_in(&tiny_timer);
    if ((void *)auStack_220._0_8_ != pvStack_228) goto LAB_00182bf1;
    auStack_220._0_8_ = (void *)0xffffffffffff;
    pcStack_230 = (code *)0x182b40;
    pvStack_228 = (void *)uv_timer_get_due_in(&huge_timer1);
    if ((void *)auStack_220._0_8_ != pvStack_228) goto LAB_00182bfe;
    auStack_220._0_8_ = (void *)0x0;
    pcStack_230 = (code *)0x182b68;
    pvStack_228 = (void *)uv_timer_get_due_in(&huge_timer2);
    if (pvStack_228 < (ulong)auStack_220._0_8_) goto LAB_00182c0b;
    pcStack_230 = (code *)0x182b80;
    puVar2 = uv_default_loop();
    pcStack_230 = (code *)0x182b8a;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00182c18;
    pcStack_230 = (code *)0x182b97;
    unaff_RBX = uv_default_loop();
    pcStack_230 = (code *)0x182bab;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_230 = (code *)0x182bb5;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_230 = (code *)0x182bba;
    puVar2 = uv_default_loop();
    pcStack_230 = (code *)0x182bc2;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      pcStack_230 = (code *)0x182bcb;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_230 = (code *)0x182bd8;
    run_test_timer_huge_timeout_cold_1();
LAB_00182bd8:
    pcStack_230 = (code *)0x182bdd;
    run_test_timer_huge_timeout_cold_2();
LAB_00182bdd:
    pcStack_230 = (code *)0x182be2;
    run_test_timer_huge_timeout_cold_3();
LAB_00182be2:
    pcStack_230 = (code *)0x182be7;
    run_test_timer_huge_timeout_cold_4();
LAB_00182be7:
    pcStack_230 = (code *)0x182bec;
    run_test_timer_huge_timeout_cold_5();
LAB_00182bec:
    pcStack_230 = (code *)0x182bf1;
    run_test_timer_huge_timeout_cold_6();
LAB_00182bf1:
    pcStack_230 = (code *)0x182bfe;
    run_test_timer_huge_timeout_cold_7();
LAB_00182bfe:
    pcStack_230 = (code *)0x182c0b;
    run_test_timer_huge_timeout_cold_8();
LAB_00182c0b:
    puVar2 = (uv_loop_t *)auStack_220;
    pcStack_230 = (code *)0x182c18;
    run_test_timer_huge_timeout_cold_11();
LAB_00182c18:
    pcStack_230 = (code *)0x182c1d;
    run_test_timer_huge_timeout_cold_9();
  }
  pcStack_230 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_10();
  if (puVar2 == (uv_loop_t *)&tiny_timer) {
    puStack_238 = (uv_loop_t *)0x182c3d;
    uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
    puStack_238 = (uv_loop_t *)0x182c4b;
    uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&huge_timer2,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  puStack_238 = (uv_loop_t *)run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_240 = (code *)0x182c65;
  puStack_238 = unaff_RBX;
  loop = (uv_timer_t *)uv_default_loop();
  pcStack_240 = (code *)0x182c74;
  iVar1 = uv_timer_init((uv_loop_t *)loop,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_240 = (code *)0x182c81;
    loop = (uv_timer_t *)uv_default_loop();
    pcStack_240 = (code *)0x182c90;
    iVar1 = uv_timer_init((uv_loop_t *)loop,&huge_timer1);
    if (iVar1 != 0) goto LAB_00182d31;
    loop = &tiny_timer;
    pcStack_240 = (code *)0x182cb5;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    if (iVar1 != 0) goto LAB_00182d36;
    loop = &huge_timer1;
    pcStack_240 = (code *)0x182cd8;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_00182d3b;
    pcStack_240 = (code *)0x182ce1;
    loop = (uv_timer_t *)uv_default_loop();
    pcStack_240 = (code *)0x182ceb;
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00182d40;
    pcStack_240 = (code *)0x182cf4;
    unaff_RBX = uv_default_loop();
    pcStack_240 = (code *)0x182d08;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_240 = (code *)0x182d12;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_240 = (code *)0x182d17;
    loop = (uv_timer_t *)uv_default_loop();
    pcStack_240 = (code *)0x182d1f;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      pcStack_240 = (code *)0x182d28;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_240 = (code *)0x182d31;
    run_test_timer_huge_repeat_cold_1();
LAB_00182d31:
    pcStack_240 = (code *)0x182d36;
    run_test_timer_huge_repeat_cold_2();
LAB_00182d36:
    pcStack_240 = (code *)0x182d3b;
    run_test_timer_huge_repeat_cold_3();
LAB_00182d3b:
    pcStack_240 = (code *)0x182d40;
    run_test_timer_huge_repeat_cold_4();
LAB_00182d40:
    pcStack_240 = (code *)0x182d45;
    run_test_timer_huge_repeat_cold_5();
  }
  pcStack_240 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  iVar1 = huge_repeat_cb::ncalls;
  pcStack_240._0_4_ = extraout_EAX_00;
  if (huge_repeat_cb::ncalls != 0) {
    if (loop == &tiny_timer) goto LAB_00182d72;
    puStack_248 = (uv_loop_t *)0x182d66;
    huge_repeat_cb_cold_1();
    iVar1 = extraout_EAX_01;
  }
  if (loop == &huge_timer1) {
LAB_00182d72:
    huge_repeat_cb::ncalls = iVar1 + 1;
    if (huge_repeat_cb::ncalls != 10) {
      return (int)pcStack_240;
    }
    puStack_248 = (uv_loop_t *)0x182d8d;
    uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
    return extraout_EAX_02;
  }
  puStack_248 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_248 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&uStack_2e0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_2e0,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_00182ebb;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_00182ec0;
    if (timer_run_once_timer_cb_called != 1) goto LAB_00182ec5;
    iVar1 = uv_timer_start(&uStack_2e0,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00182eca;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_00182ecf;
    if (timer_run_once_timer_cb_called != 2) goto LAB_00182ed4;
    uv_close((uv_handle_t *)&uStack_2e0,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00182ede;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_00182ebb:
    run_test_timer_run_once_cold_2();
LAB_00182ec0:
    run_test_timer_run_once_cold_3();
LAB_00182ec5:
    run_test_timer_run_once_cold_4();
LAB_00182eca:
    run_test_timer_run_once_cold_5();
LAB_00182ecf:
    run_test_timer_run_once_cold_6();
LAB_00182ed4:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_00182ede:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(timer_init) {
  uv_timer_t handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &handle));
  ASSERT(0 == uv_timer_get_repeat(&handle));
  ASSERT_UINT64_LE(0, uv_timer_get_due_in(&handle));
  ASSERT(0 == uv_is_active((uv_handle_t*) &handle));

  MAKE_VALGRIND_HAPPY();
  return 0;
}